

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.cpp
# Opt level: O0

bool __thiscall ObjectIdentifier::ToString(ObjectIdentifier *this,string *out)

{
  unsigned_long uVar1;
  bool bVar2;
  size_type sVar3;
  byte *pbVar4;
  const_reference pvVar5;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined4 local_64;
  unsigned_long local_60;
  unsigned_long node;
  size_t pos;
  size_t cbRead;
  string tmp;
  char *szOid;
  string *out_local;
  ObjectIdentifier *this_local;
  
  tmp.field_2._8_8_ = GetOidString(this);
  if ((char *)tmp.field_2._8_8_ != (char *)0x0) {
    std::__cxx11::string::operator=((string *)out,(char *)tmp.field_2._8_8_);
  }
  std::__cxx11::string::string((string *)&cbRead);
  pos = 0;
  node = 0;
  local_60 = 0;
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->value);
  if (sVar3 == 0) {
    this_local._7_1_ = false;
  }
  else {
    pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&this->value,0);
    if (*pbVar4 < 0x28) {
      std::__cxx11::string::operator=((string *)&cbRead,"0");
      pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->value,0);
      std::__cxx11::to_string(&local_b8,(uint)*pbVar4);
      std::operator+(&local_98,".",&local_b8);
      std::__cxx11::string::operator+=((string *)&cbRead,(string *)&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_b8);
      pos = 1;
    }
    else {
      pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->value,0);
      if (*pbVar4 < 0x50) {
        std::__cxx11::string::operator=((string *)&cbRead,"1");
        pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (&this->value,0);
        std::__cxx11::to_string(&local_f8,*pbVar4 - 0x28);
        std::operator+(&local_d8,".",&local_f8);
        std::__cxx11::string::operator+=((string *)&cbRead,(string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_f8);
        pos = 1;
      }
      else {
        pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (&this->value,0);
        sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->value);
        bVar2 = DecodeLong(this,pvVar5,sVar3,&local_60,&pos);
        if ((!bVar2) || (local_60 < 0x50)) {
          this_local._7_1_ = false;
          goto LAB_00158473;
        }
        std::__cxx11::string::operator=((string *)&cbRead,"2");
        std::__cxx11::to_string(&local_138,local_60 - 0x50);
        std::operator+(&local_118,".",&local_138);
        std::__cxx11::string::operator+=((string *)&cbRead,(string *)&local_118);
        std::__cxx11::string::~string((string *)&local_118);
        std::__cxx11::string::~string((string *)&local_138);
      }
    }
    for (node = pos; uVar1 = node,
        sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->value),
        uVar1 < sVar3; node = pos + node) {
      pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->value,node);
      sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->value);
      bVar2 = DecodeLong(this,pvVar5,sVar3,&local_60,&pos);
      if (!bVar2) {
        this_local._7_1_ = false;
        goto LAB_00158473;
      }
      std::__cxx11::to_string(&local_178,local_60);
      std::operator+(&local_158,".",&local_178);
      std::__cxx11::string::operator+=((string *)&cbRead,(string *)&local_158);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&local_178);
    }
    std::__cxx11::string::swap((string *)out);
    this_local._7_1_ = true;
  }
LAB_00158473:
  local_64 = 1;
  std::__cxx11::string::~string((string *)&cbRead);
  return this_local._7_1_;
}

Assistant:

bool ObjectIdentifier::ToString(std::string & out) const
{
    // If possible, just look it up in our table
    const char* szOid = this->GetOidString();

    if (szOid != nullptr)
	{
		out = szOid;
	}
        
	std::string tmp;
	size_t cbRead = 0;
	size_t pos = 0;
	unsigned long node = 0;

	if (value.size() < 1)
	{
		return false;
	}
		
	if (value[0] < 40)
	{
		tmp = "0";
		tmp += "." + std::to_string(value[0]);
		cbRead = 1;
	}
	else if (value[0] < 80)
	{
		tmp = "1";
		tmp += "." + std::to_string(value[0] - 40);
		cbRead = 1;
	}
	else
	{
		if (!DecodeLong(&value[0], value.size(), node, cbRead) || node < 80)
			return false;

		tmp = "2";
		tmp += "." + std::to_string(node - 80);
	}

	pos = cbRead;

	for (; pos < value.size(); pos += cbRead)
	{
		if (!DecodeLong(&value[pos], value.size(), node, cbRead))
			return false;

		tmp += "." + std::to_string(node);
	}

	out.swap(tmp);
	return true;
}